

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O1

void __thiscall
Assimp::Discreet3DSImporter::GenerateNodeGraph(Discreet3DSImporter *this,aiScene *pcOut)

{
  char *__haystack;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  uint uVar17;
  Node *node;
  Scene *pSVar18;
  ai_uint32 aVar19;
  aiNode *paVar20;
  aiAnimation **ppaVar21;
  aiAnimation *paVar22;
  aiNodeAnim **ppaVar23;
  Logger *this_00;
  aiNode **ppaVar24;
  uint *puVar25;
  aiNode *paVar26;
  char *pcVar27;
  ulong uVar28;
  aiMatrix4x4 *in_R8;
  int iVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  uint numChannel;
  uint local_34;
  
  paVar20 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar20);
  pcOut->mRootNode = paVar20;
  node = this->mRootNode;
  if ((node->mChildren).
      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (node->mChildren).
      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"No hierarchy information has been found in the file. ");
    pSVar18 = this->mScene;
    pcOut->mRootNode->mNumChildren =
         (int)((ulong)((long)(pSVar18->mLights).
                             super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pSVar18->mLights).
                            super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) +
         (int)((ulong)((long)(pSVar18->mCameras).
                             super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pSVar18->mCameras).
                            super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3) + pcOut->mNumMeshes;
    paVar20 = pcOut->mRootNode;
    ppaVar24 = (aiNode **)operator_new__((ulong)paVar20->mNumChildren << 3);
    paVar20->mChildren = ppaVar24;
    paVar20 = pcOut->mRootNode;
    (paVar20->mName).length = 0xe;
    builtin_strncpy((paVar20->mName).data,"<3DSDummyRoot>",0xf);
    if (pcOut->mNumMeshes == 0) {
      uVar28 = 0;
    }
    else {
      uVar28 = 0;
      do {
        paVar20 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar20);
        pcOut->mRootNode->mChildren[uVar28] = paVar20;
        paVar20->mParent = pcOut->mRootNode;
        puVar25 = (uint *)operator_new__(4);
        paVar20->mMeshes = puVar25;
        *puVar25 = (uint)uVar28;
        paVar20->mNumMeshes = 1;
        aVar19 = snprintf((paVar20->mName).data,0x400,"3DSMesh_%u",uVar28 & 0xffffffff);
        (paVar20->mName).length = aVar19;
        uVar28 = uVar28 + 1;
      } while ((uint)uVar28 < pcOut->mNumMeshes);
    }
    iVar29 = (int)uVar28;
    if (((long)(this->mScene->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->mScene->mCameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) {
      uVar28 = 0;
      do {
        paVar26 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar26);
        pcOut->mRootNode->mChildren[(uint)(iVar29 + (int)uVar28)] = paVar26;
        paVar26->mParent = pcOut->mRootNode;
        paVar20 = (aiNode *)
                  (this->mScene->mCameras).
                  super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar28];
        if (paVar26 != paVar20) {
          uVar17 = (paVar20->mName).length;
          (paVar26->mName).length = uVar17;
          memcpy((paVar26->mName).data,(paVar20->mName).data,(ulong)uVar17);
          (paVar26->mName).data[uVar17] = '\0';
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < ((ulong)((long)(this->mScene->mCameras).
                                       super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->mScene->mCameras).
                                      super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff));
      iVar29 = iVar29 + (int)uVar28;
    }
    if (((long)(this->mScene->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(this->mScene->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0) {
      uVar28 = 0;
      do {
        paVar26 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar26);
        pcOut->mRootNode->mChildren[(uint)(iVar29 + (int)uVar28)] = paVar26;
        paVar26->mParent = pcOut->mRootNode;
        paVar20 = (aiNode *)
                  (this->mScene->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar28];
        if (paVar26 != paVar20) {
          uVar17 = (paVar20->mName).length;
          (paVar26->mName).length = uVar17;
          memcpy((paVar26->mName).data,(paVar20->mName).data,(ulong)uVar17);
          (paVar26->mName).data[uVar17] = '\0';
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < ((ulong)((long)(this->mScene->mLights).
                                       super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->mScene->mLights).
                                      super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff));
    }
  }
  else {
    local_34 = 0;
    CountTracks(node,&local_34);
    uVar28 = (ulong)local_34;
    if (uVar28 != 0) {
      pcOut->mNumAnimations = 1;
      ppaVar21 = (aiAnimation **)operator_new__(8);
      pcOut->mAnimations = ppaVar21;
      paVar22 = (aiAnimation *)operator_new(0x448);
      (paVar22->mName).length = 0;
      (paVar22->mName).data[0] = '\0';
      memset((paVar22->mName).data + 1,0x1b,0x3ff);
      paVar22->mDuration = -1.0;
      paVar22->mTicksPerSecond = 0.0;
      paVar22->mNumChannels = 0;
      paVar22->mChannels = (aiNodeAnim **)0x0;
      paVar22->mNumMeshChannels = 0;
      paVar22->mMeshChannels = (aiMeshAnim **)0x0;
      paVar22->mNumMorphMeshChannels = 0;
      paVar22->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
      *ppaVar21 = paVar22;
      (paVar22->mName).length = 0xd;
      builtin_strncpy((paVar22->mName).data,"3DSMasterAnim",0xe);
      ppaVar23 = (aiNodeAnim **)operator_new__(uVar28 << 3);
      paVar22->mChannels = ppaVar23;
    }
    AddNodeToGraph(this,pcOut,pcOut->mRootNode,this->mRootNode,in_R8);
  }
  if (pcOut->mNumMeshes != 0) {
    uVar28 = 0;
    do {
      pcOut->mMeshes[uVar28]->mColors[0] = (aiColor4D *)0x0;
      pcOut->mMeshes[uVar28]->mColors[1] = (aiColor4D *)0x0;
      uVar28 = uVar28 + 1;
    } while (uVar28 < pcOut->mNumMeshes);
  }
  paVar20 = pcOut->mRootNode;
  fVar1 = (paVar20->mTransformation).b1;
  fVar30 = fVar1 * 0.0;
  fVar2 = (paVar20->mTransformation).a1;
  fVar3 = (paVar20->mTransformation).a2;
  fVar4 = (paVar20->mTransformation).c1;
  fVar39 = fVar4 * 0.0;
  fVar5 = (paVar20->mTransformation).d1;
  fVar33 = fVar2 * 0.0;
  fVar31 = fVar30 + fVar33;
  fVar42 = fVar5 * 0.0;
  fVar6 = (paVar20->mTransformation).b2;
  fVar43 = fVar6 * 0.0;
  fVar7 = (paVar20->mTransformation).c2;
  fVar35 = fVar7 * 0.0;
  fVar8 = (paVar20->mTransformation).d2;
  fVar32 = fVar3 * 0.0;
  fVar44 = fVar43 + fVar32;
  fVar40 = fVar8 * 0.0;
  fVar9 = (paVar20->mTransformation).b3;
  fVar46 = fVar9 * 0.0;
  fVar10 = (paVar20->mTransformation).a3;
  fVar11 = (paVar20->mTransformation).c3;
  fVar49 = fVar11 * 0.0;
  fVar48 = fVar10 * 0.0;
  fVar47 = fVar46 + fVar48;
  fVar12 = (paVar20->mTransformation).d3;
  fVar45 = fVar12 * 0.0;
  fVar13 = (paVar20->mTransformation).b4;
  fVar36 = fVar13 * 0.0;
  fVar14 = (paVar20->mTransformation).a4;
  fVar15 = (paVar20->mTransformation).c4;
  fVar41 = fVar15 * 0.0;
  fVar34 = fVar14 * 0.0;
  fVar37 = fVar36 + fVar34;
  fVar16 = (paVar20->mTransformation).d4;
  fVar38 = fVar16 * 0.0;
  (paVar20->mTransformation).a1 = fVar2 + fVar30 + fVar39 + fVar42;
  (paVar20->mTransformation).a2 = fVar3 + fVar43 + fVar35 + fVar40;
  (paVar20->mTransformation).a3 = fVar10 + fVar46 + fVar49 + fVar45;
  (paVar20->mTransformation).a4 = fVar14 + fVar36 + fVar41 + fVar38;
  (paVar20->mTransformation).b1 = fVar4 + fVar31 + fVar42;
  (paVar20->mTransformation).b2 = fVar7 + fVar44 + fVar40;
  (paVar20->mTransformation).b3 = fVar11 + fVar47 + fVar45;
  (paVar20->mTransformation).b4 = fVar15 + fVar37 + fVar38;
  (paVar20->mTransformation).c1 = (fVar33 - fVar1) + fVar39 + fVar42;
  (paVar20->mTransformation).c2 = (fVar32 - fVar6) + fVar35 + fVar40;
  (paVar20->mTransformation).c3 = (fVar48 - fVar9) + fVar49 + fVar45;
  (paVar20->mTransformation).c4 = (fVar34 - fVar13) + fVar41 + fVar38;
  (paVar20->mTransformation).d1 = fVar31 + fVar39 + fVar5;
  (paVar20->mTransformation).d2 = fVar44 + fVar35 + fVar8;
  (paVar20->mTransformation).d3 = fVar47 + fVar49 + fVar12;
  (paVar20->mTransformation).d4 = fVar37 + fVar41 + fVar16;
  paVar20 = pcOut->mRootNode;
  __haystack = (paVar20->mName).data;
  pcVar27 = strstr(__haystack,"UNNAMED");
  if ((pcVar27 != (char *)0x0) || ((*__haystack == '$' && ((paVar20->mName).data[1] == '$')))) {
    (paVar20->mName).length = 9;
    builtin_strncpy(__haystack,"<3DSRoot>",10);
  }
  return;
}

Assistant:

void Discreet3DSImporter::GenerateNodeGraph(aiScene* pcOut)
{
    pcOut->mRootNode = new aiNode();
    if (0 == mRootNode->mChildren.size())
    {
        //////////////////////////////////////////////////////////////////////////////
        // It seems the file is so messed up that it has not even a hierarchy.
        // generate a flat hiearachy which looks like this:
        //
        //                ROOT_NODE
        //                   |
        //   ----------------------------------------
        //   |       |       |            |         |
        // MESH_0  MESH_1  MESH_2  ...  MESH_N    CAMERA_0 ....
        //
        ASSIMP_LOG_WARN("No hierarchy information has been found in the file. ");

        pcOut->mRootNode->mNumChildren = pcOut->mNumMeshes +
            static_cast<unsigned int>(mScene->mCameras.size() + mScene->mLights.size());

        pcOut->mRootNode->mChildren = new aiNode* [ pcOut->mRootNode->mNumChildren ];
        pcOut->mRootNode->mName.Set("<3DSDummyRoot>");

        // Build dummy nodes for all meshes
        unsigned int a = 0;
        for (unsigned int i = 0; i < pcOut->mNumMeshes;++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;
            pcNode->mMeshes = new unsigned int[1];
            pcNode->mMeshes[0] = i;
            pcNode->mNumMeshes = 1;

            // Build a name for the node
            pcNode->mName.length = ai_snprintf(pcNode->mName.data, MAXLEN, "3DSMesh_%u",i);
        }

        // Build dummy nodes for all cameras
        for (unsigned int i = 0; i < (unsigned int )mScene->mCameras.size();++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;

            // Build a name for the node
            pcNode->mName = mScene->mCameras[i]->mName;
        }

        // Build dummy nodes for all lights
        for (unsigned int i = 0; i < (unsigned int )mScene->mLights.size();++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;

            // Build a name for the node
            pcNode->mName = mScene->mLights[i]->mName;
        }
    }
    else
    {
        // First of all: find out how many scaling, rotation and translation
        // animation tracks we'll have afterwards
        unsigned int numChannel = 0;
        CountTracks(mRootNode,numChannel);

        if (numChannel)
        {
            // Allocate a primary animation channel
            pcOut->mNumAnimations = 1;
            pcOut->mAnimations    = new aiAnimation*[1];
            aiAnimation* anim     = pcOut->mAnimations[0] = new aiAnimation();

            anim->mName.Set("3DSMasterAnim");

            // Allocate enough storage for all node animation channels,
            // but don't set the mNumChannels member - we'll use it to
            // index into the array
            anim->mChannels = new aiNodeAnim*[numChannel];
        }

        aiMatrix4x4 m;
        AddNodeToGraph(pcOut,  pcOut->mRootNode, mRootNode,m);
    }

    // We used the first and second vertex color set to store some temporary values so we need to cleanup here
    for (unsigned int a = 0; a < pcOut->mNumMeshes; ++a)
    {
        pcOut->mMeshes[a]->mColors[0] = NULL;
        pcOut->mMeshes[a]->mColors[1] = NULL;
    }

    pcOut->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f) * pcOut->mRootNode->mTransformation;

    // If the root node is unnamed name it "<3DSRoot>"
    if (::strstr( pcOut->mRootNode->mName.data, "UNNAMED" ) ||
        (pcOut->mRootNode->mName.data[0] == '$' && pcOut->mRootNode->mName.data[1] == '$') )
    {
        pcOut->mRootNode->mName.Set("<3DSRoot>");
    }
}